

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.h
# Opt level: O0

void __thiscall
cnn::LookupNode::LookupNode
          (LookupNode *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *pindices)

{
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  _func_int **in_RSI;
  ParameterNodeBase *in_RDI;
  
  ParameterNodeBase::ParameterNodeBase(in_RDI);
  (in_RDI->super_Node)._vptr_Node = (_func_int **)&PTR__LookupNode_00566940;
  memcpy(in_RDI + 1,in_RSI + 1,0x24);
  in_RDI[1].super_Node.dim.d[1] = 0;
  in_RDI[1].super_Node.dim.d[2] = 0;
  in_RDI[1].super_Node.dim.d[3] = 0;
  memset(in_RDI[1].super_Node.dim.d + 4,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x346400);
  in_RDI[1].super_Node.aux_mem = in_RDX;
  in_RDI[2].super_Node._vptr_Node = in_RSI;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  in_RDI[1].super_Node.dim.d[0] = (uint)sVar1;
  return;
}

Assistant:

LookupNode(LookupParameters* p, const std::vector<unsigned>* pindices) : dim(p->dim), index(), pindex(), indices(), pindices(pindices), params(p) {
    dim.bd = pindices->size();
  }